

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmulNet.cpp
# Opt level: O2

int __thiscall EmulNet::ENcleanup(EmulNet *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  FILE *__stream;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  uint local_48;
  uint local_44;
  int (*local_40) [3600];
  
  (this->emulnet).nextid = 0;
  __stream = fopen("msgcount.log","w+");
  while (iVar5 = (this->emulnet).currbuffsize, 0 < iVar5) {
    uVar2 = iVar5 - 1;
    (this->emulnet).currbuffsize = uVar2;
    free((this->emulnet).buff[uVar2]);
  }
  local_40 = this->recv_msgs;
  for (uVar6 = 1; local_40 = local_40 + 1, (long)uVar6 <= (long)this->par->EN_GPSZ;
      uVar6 = uVar6 + 1) {
    uVar4 = 0;
    fprintf(__stream,"node %3d ",uVar6 & 0xffffffff);
    iVar5 = 9;
    local_44 = 0;
    local_48 = 0;
    while( true ) {
      iVar3 = Params::getcurrtime(this->par);
      if ((long)iVar3 <= (long)uVar4) break;
      uVar2 = local_40[-0x3e9][uVar4];
      uVar1 = (*local_40)[uVar4];
      if (uVar6 == 0x43) {
        fprintf(__stream,"special %4d %4d %4d\n",uVar4 & 0xffffffff,(ulong)uVar2,(ulong)uVar1);
      }
      else {
        fprintf(__stream," (%4d, %4d)",(ulong)uVar2,(ulong)uVar1);
        if ((int)((uVar4 & 0xffffffff) / 10) * 10 + iVar5 == 0) {
          fwrite("\n         ",10,1,__stream);
        }
      }
      local_44 = local_44 + uVar2;
      local_48 = local_48 + uVar1;
      uVar4 = uVar4 + 1;
      iVar5 = iVar5 + -1;
    }
    fputc(10,__stream);
    fprintf(__stream,"node %3d sent_total %6u  recv_total %6u\n\n",uVar6 & 0xffffffff,
            (ulong)local_44,(ulong)local_48);
  }
  fclose(__stream);
  return 0;
}

Assistant:

int EmulNet::ENcleanup() {
	emulnet.nextid=0;
	int i, j;
	int sent_total, recv_total;

	FILE* file = fopen("msgcount.log", "w+");

	while(emulnet.currbuffsize > 0) {
		free(emulnet.buff[--emulnet.currbuffsize]);
	}

	for ( i = 1; i <= par->EN_GPSZ; i++ ) {
		fprintf(file, "node %3d ", i);
		sent_total = 0;
		recv_total = 0;

		for (j = 0; j < par->getcurrtime(); j++) {

			sent_total += sent_msgs[i][j];
			recv_total += recv_msgs[i][j];
			if (i != 67) {
				fprintf(file, " (%4d, %4d)", sent_msgs[i][j], recv_msgs[i][j]);
				if (j % 10 == 9) {
					fprintf(file, "\n         ");
				}
			}
			else {
				fprintf(file, "special %4d %4d %4d\n", j, sent_msgs[i][j], recv_msgs[i][j]);
			}
		}
		fprintf(file, "\n");
		fprintf(file, "node %3d sent_total %6u  recv_total %6u\n\n", i, sent_total, recv_total);
	}

	fclose(file);
	return 0;
}